

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall Trainer::Node::updateStrategy(Node *this)

{
  double local_30;
  int local_20;
  int local_1c;
  int a_1;
  int a;
  double normalizingSum;
  Node *this_local;
  
  if ((this->mNeedToUpdateStrategy & 1U) != 0) {
    _a_1 = 0.0;
    for (local_1c = 0; local_1c < (int)(uint)this->mActionNum; local_1c = local_1c + 1) {
      if (this->mRegretSum[local_1c] <= 0.0) {
        local_30 = 0.0;
      }
      else {
        local_30 = this->mRegretSum[local_1c];
      }
      this->mStrategy[local_1c] = local_30;
      _a_1 = this->mStrategy[local_1c] + _a_1;
    }
    for (local_20 = 0; local_20 < (int)(uint)this->mActionNum; local_20 = local_20 + 1) {
      if (_a_1 <= 0.0) {
        this->mStrategy[local_20] = 1.0 / (double)this->mActionNum;
      }
      else {
        this->mStrategy[local_20] = this->mStrategy[local_20] / _a_1;
      }
    }
  }
  return;
}

Assistant:

void Node::updateStrategy() {
    if (!mNeedToUpdateStrategy) {
        return;
    }
    double normalizingSum = 0.0;
    for (int a = 0; a < mActionNum; ++a) {
        mStrategy[a] = mRegretSum[a] > 0 ? mRegretSum[a] : 0;
        normalizingSum += mStrategy[a];
    }
    for (int a = 0; a < mActionNum; ++a) {
        if (normalizingSum > 0) {
            mStrategy[a] /= normalizingSum;
        } else {
            mStrategy[a] = 1.0 / (double) mActionNum;
        }
    }
}